

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedFloatType<float>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedFloatType<float> min,WrappedFloatType<float> max,float gridSize)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  uint uVar10;
  float fVar11;
  WrappedFloatType<float> WVar12;
  float fVar13;
  float in_XMM7_Da;
  WrappedFloatType<float> in_XMM8_Da;
  WrappedFloatType<float> local_a8;
  float local_a4;
  WrappedFloatType<float> minDiff;
  float local_98;
  float local_88;
  float local_84;
  deRandom rnd;
  
  iVar1 = componentCount * 4;
  if (stride != 0) {
    iVar1 = stride;
  }
  iVar2 = iVar1 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar2 = 0;
  }
  local_a4 = gridSize;
  pcVar3 = (char *)operator_new__((long)(iVar2 * count + offset));
  deRandom_init(&rnd,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar11 = max.m_value - min.m_value;
    uVar10 = -(uint)(-fVar11 <= fVar11);
    fVar11 = (float)(~uVar10 & (uint)-fVar11 | (uint)fVar11 & uVar10) * local_a4;
    WVar12.m_value = 4.0;
    minDiff.m_value = 4.0;
    if (4.0 <= fVar11) {
      minDiff.m_value = fVar11;
    }
    if (count < 1) {
      count = 0;
    }
    iVar5 = 8;
    iVar7 = 0xc;
    for (uVar6 = 0; uVar6 != (uint)count; uVar6 = uVar6 + 1) {
      iVar8 = 4;
      do {
        bVar9 = iVar8 == 0;
        iVar8 = iVar8 + -1;
        if (bVar9) break;
        local_a8.m_value =
             (float)getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                              (&rnd,min.m_value,max.m_value);
        local_84 = (float)roundTo<deqp::gls::GLValue::WrappedFloatType<float>>(&minDiff,&local_a8);
        local_a8.m_value =
             (float)getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                              (&rnd,minDiff.m_value,ABS(max.m_value - local_84));
        local_a4 = (float)roundTo<deqp::gls::GLValue::WrappedFloatType<float>>(&minDiff,&local_a8);
        local_a8.m_value =
             (float)getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                              (&rnd,min.m_value,max.m_value);
        local_88 = (float)roundTo<deqp::gls::GLValue::WrappedFloatType<float>>(&minDiff,&local_a8);
        local_a8.m_value =
             (float)getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                              (&rnd,minDiff.m_value,ABS(max.m_value - local_88));
        local_98 = (float)roundTo<deqp::gls::GLValue::WrappedFloatType<float>>(&minDiff,&local_a8);
        if (componentCount < 3) {
          in_XMM8_Da.m_value = 0.0;
          WVar12.m_value = 1.0;
          in_XMM7_Da = local_a4;
          break;
        }
        local_a8.m_value =
             (float)getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                              (&rnd,min.m_value,max.m_value);
        in_XMM8_Da = roundTo<deqp::gls::GLValue::WrappedFloatType<float>>(&minDiff,&local_a8);
        WVar12.m_value = 1.0;
        if (componentCount != 3) {
          local_a8.m_value =
               (float)getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                                (&rnd,min.m_value,max.m_value);
          WVar12 = roundTo<deqp::gls::GLValue::WrappedFloatType<float>>(&minDiff,&local_a8);
        }
        fVar11 = local_a4 + in_XMM8_Da.m_value;
        uVar10 = -(uint)(-fVar11 <= fVar11);
        in_XMM7_Da = local_a4;
      } while (((float)(~uVar10 & (uint)-fVar11 | (uint)fVar11 & uVar10) < minDiff.m_value) ||
              (fVar11 = local_98 + WVar12.m_value, uVar10 = -(uint)(-fVar11 <= fVar11),
              (float)(~uVar10 & (uint)-fVar11 | (uint)fVar11 & uVar10) < minDiff.m_value));
      iVar8 = iVar2 * (int)uVar6;
      *(float *)(pcVar3 + (long)iVar8 + (long)offset) = local_84;
      *(float *)(pcVar3 + (long)(iVar8 + 4) + (long)offset) = local_88;
      fVar13 = local_84 + in_XMM7_Da;
      *(float *)(pcVar3 + (long)(iVar8 + iVar1) + (long)offset) = fVar13;
      *(float *)(pcVar3 + (long)(iVar8 + 4 + iVar1) + (long)offset) = local_88;
      *(float *)(pcVar3 + (long)(iVar8 + iVar1 * 2) + (long)offset) = local_84;
      fVar11 = local_88 + local_98;
      *(float *)(pcVar3 + (long)(iVar8 + 4 + iVar1 * 2) + (long)offset) = fVar11;
      *(float *)(pcVar3 + (long)(iVar8 + iVar1 * 3) + (long)offset) = local_84;
      *(float *)(pcVar3 + (long)(iVar8 + 4 + iVar1 * 3) + (long)offset) = fVar11;
      *(float *)(pcVar3 + (long)(iVar8 + iVar1 * 4) + (long)offset) = fVar13;
      *(float *)(pcVar3 + (long)(iVar8 + 4 + iVar1 * 4) + (long)offset) = local_88;
      *(float *)(pcVar3 + (long)(iVar8 + iVar1 * 5) + (long)offset) = fVar13;
      *(float *)(pcVar3 + (long)(iVar8 + iVar1 * 5 + 4) + (long)offset) = fVar11;
      if (2 < componentCount) {
        lVar4 = 6;
        iVar8 = iVar5;
        while (bVar9 = lVar4 != 0, lVar4 = lVar4 + -1, bVar9) {
          *(float *)(pcVar3 + (long)iVar8 + (long)offset) = in_XMM8_Da.m_value;
          iVar8 = iVar8 + iVar1;
        }
        if (componentCount != 3) {
          lVar4 = 6;
          iVar8 = iVar7;
          while (bVar9 = lVar4 != 0, lVar4 = lVar4 + -1, bVar9) {
            *(float *)(pcVar3 + (long)iVar8 + (long)offset) = WVar12.m_value;
            iVar8 = iVar8 + iVar1;
          }
        }
      }
      iVar5 = iVar5 + iVar2;
      iVar7 = iVar7 + iVar2;
    }
  }
  return pcVar3;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}